

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageOrderModification.cpp
# Opt level: O3

EStatusCode
AddPageToNewTree(unsigned_long inPageIndex,PDFWriter *inWriter,
                PDFDocumentCopyingContext *inCopyingContext)

{
  iteratorType iVar1;
  EStatusCode EVar2;
  int iVar3;
  DocumentContext *this;
  CatalogInformation *this_00;
  ObjectsContext *pOVar4;
  IndirectObjectsReferenceRegistry *inObjectsRegistry;
  PDFParser *this_01;
  ObjectIDType inPageID;
  ObjectIDType inObjectReference;
  PDFDictionary *inOriginal;
  DictionaryContext *this_02;
  string *psVar5;
  MapIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
  pageDictionaryObjectIt;
  PDFObjectCastPtr<PDFDictionary> pageDictionaryObject;
  MapIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
  local_80;
  PDFDocumentCopyingContext *local_68;
  RefCountPtr<PDFDictionary> local_60;
  string local_50;
  
  local_68 = inCopyingContext;
  this = PDFWriter::GetDocumentContext(inWriter);
  this_00 = PDFHummus::DocumentContext::GetCatalogInformation(this);
  pOVar4 = PDFWriter::GetObjectsContext(inWriter);
  inObjectsRegistry = ObjectsContext::GetInDirectObjectsRegistry(pOVar4);
  this_01 = PDFWriter::GetModifiedFileParser(inWriter);
  inPageID = PDFParser::GetPageObjectID(this_01,inPageIndex);
  inObjectReference = CatalogInformation::AddPageToPageTree(this_00,inPageID,inObjectsRegistry);
  inOriginal = PDFParser::ParsePage(this_01,inPageIndex);
  local_60.mValue = PDFObjectCast<PDFDictionary>(&inOriginal->super_PDFObject);
  local_60._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_003a58a0;
  PDFDictionary::GetIterator(&local_80,local_60.mValue);
  pOVar4 = PDFWriter::GetObjectsContext(inWriter);
  EVar2 = ObjectsContext::StartModifiedIndirectObject(pOVar4,inPageID);
  if (EVar2 == eSuccess) {
    this_02 = ObjectsContext::StartDictionary(pOVar4);
    if (local_80.
        super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
        .mCurrentPosition._M_node !=
        local_80.
        super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
        .mEndPosition._M_node) {
      do {
        iVar1._M_node =
             local_80.
             super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
             .mEndPosition._M_node;
        if (local_80.
            super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
            .mFirstMove == true) {
          local_80.
          super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
          .mFirstMove = false;
        }
        else {
          local_80.
          super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
          .mCurrentPosition._M_node =
               (_Base_ptr)
               std::_Rb_tree_increment
                         (local_80.
                          super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                          .mCurrentPosition._M_node);
          if (local_80.
              super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
              .mCurrentPosition._M_node == iVar1._M_node) break;
        }
        psVar5 = PDFName::GetValue_abi_cxx11_
                           (*(PDFName **)
                             (local_80.
                              super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                              .mCurrentPosition._M_node + 1));
        iVar3 = std::__cxx11::string::compare((char *)psVar5);
        if (iVar3 != 0) {
          psVar5 = PDFName::GetValue_abi_cxx11_
                             (*(PDFName **)
                               (local_80.
                                super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                                .mCurrentPosition._M_node + 1));
          DictionaryContext::WriteKey(this_02,psVar5);
          PDFDocumentCopyingContext::CopyDirectObjectAsIs
                    (local_68,(PDFObject *)
                              local_80.
                              super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                              .mCurrentPosition._M_node[1]._M_parent);
        }
      } while (local_80.
               super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
               .mCurrentPosition._M_node !=
               local_80.
               super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
               .mEndPosition._M_node);
    }
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Parent","");
    DictionaryContext::WriteKey(this_02,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    DictionaryContext::WriteNewObjectReferenceValue(this_02,inObjectReference);
    ObjectsContext::EndDictionary(pOVar4,this_02);
    ObjectsContext::EndIndirectObject(pOVar4);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"failed to start modified page object\n",0x25);
  }
  RefCountPtr<PDFDictionary>::~RefCountPtr(&local_60);
  return EVar2;
}

Assistant:

static EStatusCode AddPageToNewTree(unsigned long inPageIndex, PDFWriter& inWriter, PDFDocumentCopyingContext* inCopyingContext) {
	CatalogInformation& catalogInformation = inWriter.GetDocumentContext().GetCatalogInformation();
	IndirectObjectsReferenceRegistry& objectsRegistry = inWriter.GetObjectsContext().GetInDirectObjectsRegistry();
	PDFParser& modifiedFileParser = inWriter.GetModifiedFileParser();

	ObjectIDType pageObjectId = modifiedFileParser.GetPageObjectID(inPageIndex);

	// re-add the page to the new page tree
	ObjectIDType newParent =  catalogInformation.AddPageToPageTree(pageObjectId, objectsRegistry);

	// now modify the page object to refer to the new parent
	PDFObjectCastPtr<PDFDictionary> pageDictionaryObject = modifiedFileParser.ParsePage(inPageIndex);
	MapIterator<PDFNameToPDFObjectMap>  pageDictionaryObjectIt = pageDictionaryObject->GetIterator();
	ObjectsContext& objectContext = inWriter.GetObjectsContext();


	EStatusCode status = objectContext.StartModifiedIndirectObject(pageObjectId);
	if(status != eSuccess) {
		cout<<"failed to start modified page object\n";
		return status;
	}
	DictionaryContext* modifiedPageObject = objectContext.StartDictionary();

	// copy all elements of the page to the new page object, but the "Parent" element
	while (pageDictionaryObjectIt.MoveNext())
	{
		if (pageDictionaryObjectIt.GetKey()->GetValue() != "Parent")
		{
			modifiedPageObject->WriteKey(pageDictionaryObjectIt.GetKey()->GetValue());
			inCopyingContext->CopyDirectObjectAsIs(pageDictionaryObjectIt.GetValue());
		}
	}

	// now add parent entry
	modifiedPageObject->WriteKey("Parent");
	modifiedPageObject->WriteNewObjectReferenceValue(newParent);

	objectContext.EndDictionary(modifiedPageObject);
	objectContext.EndIndirectObject();

	return status;

}